

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_string_field_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_string_field_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_138;
  Message local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  Type local_e8 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  PriceField field;
  allocator<char> local_b9;
  string local_b8 [32];
  FieldDef local_98 [8];
  FieldDef field_def;
  string local_68 [55];
  allocator<char> local_31;
  undefined1 local_30 [8];
  string value;
  PriceUpdateDecoderTest_test_decode_string_field_Test *this_local;
  
  value.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"this is certainly a string",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string(local_68,(string *)local_30);
  bidfx_public_api::tools::Varint::WriteString
            (&(this->super_PriceUpdateDecoderTest).field_0x18,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"field",&local_b9);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_98,1,0x53,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&gtest_ar.message_,
             (FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_e8[1] = 3;
  local_e8[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_e0,"PriceField::STRING","field.GetType()",local_e8 + 1,
             local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_108,"value","field.GetString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_128);
  std::__cxx11::string::~string((string *)&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  FieldDef::~FieldDef(local_98);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_string_field)
{
    std::string value = "this is certainly a string";
    Varint::WriteString(buffer, value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::STRING, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::STRING, field.GetType());
    EXPECT_EQ(value, field.GetString());
}